

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

FieldDescriptor * __thiscall
google::protobuf::DescriptorPool::FindFieldByName(DescriptorPool *this,string *name)

{
  bool bVar1;
  Tables *this_00;
  Symbol SVar2;
  Symbol result;
  string *name_local;
  DescriptorPool *this_local;
  
  this_00 = internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->
                      (&this->tables_);
  SVar2 = Tables::FindByNameHelper(this_00,this,name);
  this_local = (DescriptorPool *)SVar2.field_1;
  if ((SVar2.type != FIELD) ||
     (bVar1 = FieldDescriptor::is_extension((FieldDescriptor *)this_local), bVar1)) {
    this_local = (DescriptorPool *)0x0;
  }
  return (FieldDescriptor *)this_local;
}

Assistant:

const FieldDescriptor* DescriptorPool::FindFieldByName(
    const string& name) const {
  Symbol result = tables_->FindByNameHelper(this, name);
  if (result.type == Symbol::FIELD &&
      !result.field_descriptor->is_extension()) {
    return result.field_descriptor;
  } else {
    return NULL;
  }
}